

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O0

void nn_btcp_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_list_item *pnVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_atcp *atcp;
  nn_list_item *it;
  nn_btcp *btcp;
  nn_list_item *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  long local_38;
  nn_list_item *local_28;
  
  local_38 = in_RDI;
  if (in_RDI == 0) {
    local_38 = 0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    if (*(long *)(local_38 + 0x2f0) == 0) {
      *(undefined4 *)(local_38 + 0x80) = 4;
    }
    else {
      nn_atcp_stop((nn_atcp *)0x16b417);
      *(undefined4 *)(local_38 + 0x80) = 3;
    }
  }
  if (*(int *)(local_38 + 0x80) == 3) {
    iVar1 = nn_atcp_isidle((nn_atcp *)0x16b466);
    if (iVar1 == 0) {
      return;
    }
    nn_atcp_term((nn_atcp *)0x16b481);
    nn_free((void *)0x16b492);
    *(undefined8 *)(local_38 + 0x2f0) = 0;
    nn_usock_stop((nn_usock *)0x16b4b3);
    *(undefined4 *)(local_38 + 0x80) = 4;
  }
  if (*(int *)(local_38 + 0x80) == 4) {
    iVar1 = nn_usock_isidle((nn_usock *)0x16b4f3);
    if (iVar1 == 0) {
      return;
    }
    local_28 = nn_list_begin((nn_list *)(local_38 + 0x2f8));
    while (pnVar2 = nn_list_end((nn_list *)(local_38 + 0x2f8)), local_28 != pnVar2) {
      nn_atcp_stop((nn_atcp *)0x16b572);
      local_28 = nn_list_next((nn_list *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff98);
    }
    *(undefined4 *)(local_38 + 0x80) = 5;
  }
  else {
    if (*(int *)(local_38 + 0x80) != 5) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_38 + 0x80),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
              ,0xfa);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_ESI != 2 || in_EDX != 0x85b9) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "src == NN_BTCP_SRC_ATCP && type == NN_ATCP_STOPPED",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
              ,0xe7);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_list_erase((nn_list *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98);
    nn_atcp_term((nn_atcp *)0x16b66c);
    nn_free((void *)0x16b676);
  }
  iVar1 = nn_list_empty((nn_list *)(local_38 + 0x2f8));
  if (iVar1 != 0) {
    *(undefined4 *)(local_38 + 0x80) = 1;
    nn_fsm_stopped_noevent((nn_fsm *)0x16b6a5);
    nn_ep_stopped((nn_ep *)0x16b6b6);
  }
  return;
}

Assistant:

static void nn_btcp_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_btcp *btcp;
    struct nn_list_item *it;
    struct nn_atcp *atcp;

    btcp = nn_cont (self, struct nn_btcp, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (btcp->atcp) {
            nn_atcp_stop (btcp->atcp);
            btcp->state = NN_BTCP_STATE_STOPPING_ATCP;
        }
        else {
            btcp->state = NN_BTCP_STATE_STOPPING_USOCK;
        }
    }
    if (nn_slow (btcp->state == NN_BTCP_STATE_STOPPING_ATCP)) {
        if (!nn_atcp_isidle (btcp->atcp))
            return;
        nn_atcp_term (btcp->atcp);
        nn_free (btcp->atcp);
        btcp->atcp = NULL;
        nn_usock_stop (&btcp->usock);
        btcp->state = NN_BTCP_STATE_STOPPING_USOCK;
    }
    if (nn_slow (btcp->state == NN_BTCP_STATE_STOPPING_USOCK)) {
       if (!nn_usock_isidle (&btcp->usock))
            return;
        for (it = nn_list_begin (&btcp->atcps);
              it != nn_list_end (&btcp->atcps);
              it = nn_list_next (&btcp->atcps, it)) {
            atcp = nn_cont (it, struct nn_atcp, item);
            nn_atcp_stop (atcp);
        }
        btcp->state = NN_BTCP_STATE_STOPPING_ATCPS;
        goto atcps_stopping;
    }
    if (nn_slow (btcp->state == NN_BTCP_STATE_STOPPING_ATCPS)) {
        nn_assert (src == NN_BTCP_SRC_ATCP && type == NN_ATCP_STOPPED);
        atcp = (struct nn_atcp *) srcptr;
        nn_list_erase (&btcp->atcps, &atcp->item);
        nn_atcp_term (atcp);
        nn_free (atcp);

        /*  If there are no more atcp state machines, we can stop the whole
            btcp object. */
atcps_stopping:
        if (nn_list_empty (&btcp->atcps)) {
            btcp->state = NN_BTCP_STATE_IDLE;
            nn_fsm_stopped_noevent (&btcp->fsm);
            nn_ep_stopped (btcp->ep);
            return;
        }

        return;
    }

    nn_fsm_bad_action(btcp->state, src, type);
}